

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::sparse::(anonymous_namespace)::UBOTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
::createInstance(InstanceFactory1<vkt::sparse::(anonymous_namespace)::UBOTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
                 *this,Context *context)

{
  SparseBufferTestInstance *this_00;
  
  this_00 = (SparseBufferTestInstance *)operator_new(0x188);
  sparse::anon_unknown_0::SparseBufferTestInstance::SparseBufferTestInstance
            (this_00,context,this->m_arg0);
  (this_00->super_SparseResourcesBaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__UBOTestInstance_00cfebb0;
  (this_00->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__UBOTestInstance_00cfebe0;
  this_00[1].super_SparseResourcesBaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)0x0;
  this_00[1].super_SparseResourcesBaseInstance.super_TestInstance.m_context = (Context *)0x0;
  *(undefined8 *)&this_00[1].super_SparseResourcesBaseInstance.m_queues._M_t._M_impl = 0;
  *(undefined8 *)
   &this_00[1].super_SparseResourcesBaseInstance.m_queues._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  this_00[1].super_SparseResourcesBaseInstance.m_queues._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_parent = (_Base_ptr)0x0;
  this_00[1].super_SparseResourcesBaseInstance.m_queues._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_right = (_Base_ptr)0x0;
  this_00[1].super_SparseResourcesBaseInstance.m_queues._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  this_00[1].super_SparseResourcesBaseInstance.m_deviceDriver.
  super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr =
       (DeviceDriver *)0x0;
  *(undefined8 *)
   &this_00[1].super_SparseResourcesBaseInstance.m_deviceDriver.
    super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.field_0x8 = 0;
  this_00[1].super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
  m_data.object = (VkDevice_s *)0x0;
  this_00[1].super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
  m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  this_00[1].super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
  m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00[1].super_SparseResourcesBaseInstance.m_allocator.
  super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr = (Allocator *)0x0;
  *(undefined8 *)
   &this_00[1].super_SparseResourcesBaseInstance.m_allocator.
    super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.field_0x8 = 0;
  this_00[1].super_Delegate._vptr_Delegate = (_func_int **)0x0;
  this_00[1].m_aliased = false;
  this_00[1].m_residency = false;
  this_00[1].m_nonResidentStrict = false;
  *(undefined5 *)&this_00[1].field_0x83 = 0;
  this_00[1].m_sparseQueue.queueHandle = (VkQueue)0x0;
  return (TestInstance *)this_00;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }